

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-linked_ptr.h
# Opt level: O0

linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
* __thiscall
testing::internal::
linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
::operator=(linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
            *this,linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
                  *ptr)

{
  linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
  *ptr_local;
  linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
  *this_local;
  
  if (ptr != this) {
    depart(this);
    linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>(cv::Mat)>>
    ::
    copy<testing::ActionInterface<std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>(cv::Mat)>>
              ((linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>(cv::Mat)>>
                *)this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }